

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsObjectDefinePropertyFull
          (JsValueRef object,JsValueRef key,JsValueRef value,JsValueRef getter,JsValueRef setter,
          bool writable,bool enumerable,bool configurable,bool *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsErrorCode JVar5;
  JsrtContext *pJVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  undefined7 in_register_00000089;
  void *unaff_retaddr;
  undefined1 auStack_e8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_a8 [8];
  EnterScriptObject __enterScriptObject;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  JsValueRef local_40;
  undefined4 local_38;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  propertyRecord = (PropertyRecord *)setter;
  local_40 = getter;
  pJVar6 = JsrtContext::GetCurrent();
  if (pJVar6 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  local_38 = (undefined4)CONCAT71(in_register_00000089,writable);
  scriptContext = (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_e8 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_a8,scriptContext,(ScriptEntryExitRecord *)auStack_e8,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a8);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x790,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_003756c2;
    *puVar7 = 0;
  }
  if (scriptContext->threadContext->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x791,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar3) {
LAB_003756c2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  JVar5 = JsErrorInvalidArgument;
  if (object != (JsValueRef)0x0) {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      JVar5 = JsErrorArgumentNotObject;
    }
    else {
      pRVar8 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar5 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00375387;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar8,false);
      }
      JVar5 = JsErrorInvalidArgument;
      if ((ulong)key >> 0x30 == 0 && key != (JsValueRef)0x0) {
        pRVar8 = Js::VarTo<Js::RecyclableObject>(key);
        pSVar1 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if (pSVar1 != scriptContext) {
          JVar5 = JsErrorWrongRuntime;
          if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00375387;
          key = Js::CrossSite::MarshalVar(scriptContext,pRVar8,false);
        }
        if (result == (bool *)0x0) {
          JVar5 = JsErrorNullArgument;
        }
        else {
          *result = false;
          local_50 = (PropertyRecord *)0x0;
          pRVar8 = Js::VarTo<Js::RecyclableObject>(key);
          JVar5 = InternalGetPropertyRecord(scriptContext,pRVar8,&local_50);
          if (JVar5 == JsNoError) {
            Js::PropertyDescriptor::PropertyDescriptor
                      ((PropertyDescriptor *)&__enterScriptObject.library);
            if (value != (JsValueRef)0x0) {
              Js::PropertyDescriptor::SetValue
                        ((PropertyDescriptor *)&__enterScriptObject.library,value);
            }
            if (local_40 != (Var)0x0) {
              Js::PropertyDescriptor::SetGetter
                        ((PropertyDescriptor *)&__enterScriptObject.library,local_40);
            }
            if (propertyRecord != (PropertyRecord *)0x0) {
              Js::PropertyDescriptor::SetSetter
                        ((PropertyDescriptor *)&__enterScriptObject.library,propertyRecord);
            }
            if ((char)local_38 != '\0') {
              Js::PropertyDescriptor::SetWritable
                        ((PropertyDescriptor *)&__enterScriptObject.library,true);
            }
            if (enumerable) {
              Js::PropertyDescriptor::SetEnumerable
                        ((PropertyDescriptor *)&__enterScriptObject.library,true);
            }
            if (configurable) {
              Js::PropertyDescriptor::SetConfigurable
                        ((PropertyDescriptor *)&__enterScriptObject.library,true);
            }
            pRVar8 = Js::VarTo<Js::RecyclableObject>(object);
            JVar5 = JsNoError;
            BVar4 = Js::JavascriptOperators::DefineOwnPropertyDescriptor
                              (pRVar8,local_50->pid,
                               (PropertyDescriptor *)&__enterScriptObject.library,true,scriptContext
                               ,PropertyOperation_None);
            *result = BVar4 != 0;
          }
        }
      }
    }
  }
LAB_00375387:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a8);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  return JVar5;
}

Assistant:

CHAKRA_API
JsObjectDefinePropertyFull(
    _In_ JsValueRef object,
    _In_ JsValueRef key,
    _In_opt_ JsValueRef value,
    _In_opt_ JsValueRef getter,
    _In_opt_ JsValueRef setter,
    _In_ bool writable,
    _In_ bool enumerable,
    _In_ bool configurable,
    _Out_ bool *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);
        AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(key, scriptContext);
        PARAM_NOT_NULL(result);
        *result = false;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(key), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Js::PropertyDescriptor propertyDescriptor;
        if (value)
        {
            propertyDescriptor.SetValue(value);
        }
        if (getter)
        {
            propertyDescriptor.SetGetter(getter);
        }
        if (setter)
        {
            propertyDescriptor.SetSetter(setter);
        }
        if (writable)
        {
            propertyDescriptor.SetWritable(writable);
        }
        if (enumerable)
        {
            propertyDescriptor.SetEnumerable(enumerable);
        }
        if (configurable)
        {
            propertyDescriptor.SetConfigurable(configurable);
        }

        *result = Js::JavascriptOperators::DefineOwnPropertyDescriptor(
            Js::VarTo<Js::RecyclableObject>(object), propertyRecord->GetPropertyId(),
            propertyDescriptor, true, scriptContext) != 0;
        return JsNoError;
    });
}